

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O2

QByteArray * __thiscall Parser::lexem(QByteArray *__return_storage_ptr__,Parser *this)

{
  Symbol::lexem(__return_storage_ptr__,(this->symbols).d.ptr + this->index + -1);
  return __return_storage_ptr__;
}

Assistant:

inline QByteArray lexem() { return symbols.at(index-1).lexem();}